

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::determineSupportedDepthFormat
          (TextureCubeMapArrayColorDepthAttachmentsTest *this)

{
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  GLenum GVar4;
  string local_40;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  this->m_depth_internal_format = 0x81a5;
  GVar2 = 0x1403;
  do {
    this->m_depth_type = GVar2;
    generateAndConfigureTextureObjects(this,8,1,false);
    configureNonLayeredFramebufferAttachment(this,this->m_color_texture_id,0,true,true);
    configureNonLayeredFramebufferAttachment(this,this->m_depth_texture_id,0,false,true);
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x170))(0x8ca9);
    if (iVar3 == 0x8cd5) {
      return;
    }
    GVar2 = this->m_depth_internal_format;
    if (GVar2 == 0x81a5) {
      GVar2 = 0x1405;
      GVar4 = 0x81a6;
    }
    else {
      if (GVar2 != 0x81a6) {
        if (GVar2 == 0x8cac) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Implementation does not support any known depth format",""
                    );
          tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unrecognized depth internalformat",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                   ,0x1b5);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar2 = 0x1406;
      GVar4 = 0x8cac;
    }
    this->m_depth_internal_format = GVar4;
  } while( true );
}

Assistant:

void TextureCubeMapArrayColorDepthAttachmentsTest::determineSupportedDepthFormat()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Start with 16-bit depth internalformat */
	m_depth_internal_format = GL_DEPTH_COMPONENT16;
	m_depth_type			= GL_UNSIGNED_SHORT;

	while (true)
	{
		/* Create color and depth texture objectss */
		generateAndConfigureTextureObjects(8,	  /* texture_width */
										   1,	  /* n_cubemaps */
										   false); /* should_generate_mutable_textures */

		/* Set framebuffer attachments up */
		configureNonLayeredFramebufferAttachment(m_color_texture_id, 0 /* layer */, true /* is_color_attachment */,
												 true /* should_update_draw_framebuffer */);
		configureNonLayeredFramebufferAttachment(m_depth_texture_id, 0 /* layer */, false /* is_color_attachment */,
												 true /* should_update_draw_framebuffer */);

		/* Check framebuffer status */
		const glw::GLenum framebuffer_status = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		if (GL_FRAMEBUFFER_COMPLETE == framebuffer_status)
		{
			return;
		}

		/* Current format does not work too well, try another one */
		switch (m_depth_internal_format)
		{
		case GL_DEPTH_COMPONENT16:
		{
			m_depth_internal_format = GL_DEPTH_COMPONENT24;
			m_depth_type			= GL_UNSIGNED_INT;

			break;
		}

		case GL_DEPTH_COMPONENT24:
		{
			m_depth_internal_format = GL_DEPTH_COMPONENT32F;
			m_depth_type			= GL_FLOAT;

			break;
		}

		case GL_DEPTH_COMPONENT32F:
		{
			throw tcu::NotSupportedError("Implementation does not support any known depth format");
		}

		default:
		{
			TCU_FAIL("Unrecognized depth internalformat");
		}
		} /* switch (m_depth_internal_format) */
	}	 /* while (true) */
}